

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O3

EVENT_TYPE validate_pc_signature(char *str_code)

{
  bool bVar1;
  EVENT_TYPE EVar2;
  IDENTIFICATION_STRATEGY IVar3;
  uchar *__ptr;
  PcIdentifier *identifiers;
  IDENTIFICATION_STRATEGY strategy;
  long lVar4;
  uint uVar5;
  bool bVar6;
  byte *pbVar7;
  uint calc_identifiers_size;
  int identifiers_size;
  char base64ids [17];
  PcIdentifier user_identifiers [2];
  uint local_60;
  uint local_5c;
  char local_58 [4];
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  undefined1 local_4c [16];
  undefined4 local_3c;
  undefined2 local_38;
  undefined4 local_36;
  undefined2 local_32;
  
  local_60 = 0;
  uVar5 = 0;
  __isoc99_sscanf(str_code,"%4s-%4s-%4s-%4s",local_58,local_54,local_50,local_4c);
  __ptr = unbase64(local_58,0x10,(int *)&local_5c);
  if (local_5c < 0xd) {
    local_38 = *(undefined2 *)(__ptr + 4);
    local_3c = *(undefined4 *)__ptr;
    local_36 = *(undefined4 *)(__ptr + 6);
    local_32 = *(undefined2 *)(__ptr + 10);
    free(__ptr);
    IVar3 = STRATEGY_UNKNOWN;
    identifiers = (PcIdentifier *)0x0;
    pbVar7 = (byte *)&local_3c;
    bVar1 = true;
    do {
      bVar6 = bVar1;
      strategy = (IDENTIFICATION_STRATEGY)(*pbVar7 >> 5);
      if (strategy == STRATEGY_UNKNOWN) {
        free(identifiers);
        return LICENSE_MALFORMED;
      }
      if (IVar3 != strategy) {
        if (identifiers != (PcIdentifier *)0x0) {
          free(identifiers);
        }
        generate_pc_id((PcIdentifier *)0x0,&local_60,strategy);
        identifiers = (PcIdentifier *)calloc(1,(ulong)local_60 * 6);
        generate_pc_id(identifiers,&local_60,strategy);
        IVar3 = strategy;
        uVar5 = local_60;
      }
      if (uVar5 != 0) {
        lVar4 = 0;
        do {
          if (*(short *)(*identifiers + lVar4 + 4) == *(short *)(pbVar7 + 4) &&
              *(int *)(*identifiers + lVar4) == *(int *)pbVar7) {
            free(identifiers);
            return LICENSE_OK;
          }
          lVar4 = lVar4 + 6;
        } while ((ulong)uVar5 * 6 != lVar4);
      }
      pbVar7 = (byte *)&local_36;
      bVar1 = false;
    } while (bVar6);
    free(identifiers);
    EVar2 = IDENTIFIERS_MISMATCH;
  }
  else {
    free(__ptr);
    EVar2 = ENVIRONMENT_VARIABLE_NOT_DEFINED;
  }
  return EVar2;
}

Assistant:

EVENT_TYPE validate_pc_signature(PcSignature str_code) {
	PcIdentifier user_identifiers[2];
	FUNCTION_RETURN result;
	IDENTIFICATION_STRATEGY previous_strategy_id, current_strategy_id;
	PcIdentifier* calculated_identifiers = NULL;
	unsigned int calc_identifiers_size = 0;
	int i = 0, j = 0;
	//bool found;
#ifdef _DEBUG
	printf("Comparing pc identifiers: \n");
#endif
	result = decode_pc_id(user_identifiers[0], user_identifiers[1], str_code);
	if (result != FUNC_RET_OK) {
		return result;
	}
	previous_strategy_id = STRATEGY_UNKNOWN;
	//found = false;
	for (i = 0; i < 2; i++) {
		current_strategy_id = strategy_from_pc_id(user_identifiers[i]);
		if (current_strategy_id == STRATEGY_UNKNOWN) {
			free(calculated_identifiers);
			return LICENSE_MALFORMED;
		}
		if (current_strategy_id != previous_strategy_id) {
			if (calculated_identifiers != NULL) {
				free(calculated_identifiers);
			}
			previous_strategy_id = current_strategy_id;
			generate_pc_id(NULL, &calc_identifiers_size, current_strategy_id);
			calculated_identifiers = (PcIdentifier *) malloc(
					sizeof(PcIdentifier) * calc_identifiers_size);
			memset(calculated_identifiers, 0, sizeof(PcIdentifier) * calc_identifiers_size);
			generate_pc_id(calculated_identifiers, &calc_identifiers_size,
					current_strategy_id);
		}
		//maybe skip the byte 0
		for (j = 0; j < calc_identifiers_size; j++) {
#ifdef _DEBUG
			printf("generated id: %02x%02x%02x%02x%02x%02x index %d, user_supplied id %02x%02x%02x%02x%02x%02x idx: %d\n",
					calculated_identifiers[j][0], calculated_identifiers[j][1], calculated_identifiers[j][2],
					calculated_identifiers[j][3], calculated_identifiers[j][4], calculated_identifiers[j][5], j,
					user_identifiers[i][0], user_identifiers[i][1], user_identifiers[i][2], user_identifiers[i][3], user_identifiers[i][4], user_identifiers[i][5], i);

#endif
			if (!memcmp(user_identifiers[i], calculated_identifiers[j],
					sizeof(PcIdentifier))) {
				free(calculated_identifiers);
				return LICENSE_OK;
			}
		}
	}
	free(calculated_identifiers);
	return IDENTIFIERS_MISMATCH;
}